

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLSchemaDescriptionImpl.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::XMLSchemaDescriptionImpl::setLocationHints(XMLSchemaDescriptionImpl *this,XMLCh *hint)

{
  BaseRefVectorOf<char16_t> *this_00;
  XMLCh *toAdd;
  
  this_00 = &this->fLocationHints->super_BaseRefVectorOf<char16_t>;
  toAdd = XMLString::replicate
                    (hint,(this->super_XMLSchemaDescription).super_XMLGrammarDescription.fMemMgr);
  BaseRefVectorOf<char16_t>::addElement(this_00,toAdd);
  return;
}

Assistant:

void XMLSchemaDescriptionImpl::setLocationHints(const XMLCh* const hint)
{    
    fLocationHints->addElement(XMLString::replicate(hint, XMLGrammarDescription::getMemoryManager())); 
}